

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_map.hpp
# Opt level: O3

void __thiscall
skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
::_setup_random_number_generator
          (skiplist<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>_>
           *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  mt19937_64 mt;
  random_device rd;
  ulong local_1d60 [312];
  undefined8 local_13a0;
  random_device local_1398;
  
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  local_1d60[0] = (ulong)uVar1;
  lVar2 = 1;
  uVar3 = local_1d60[0];
  do {
    uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar2;
    local_1d60[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x138);
  local_13a0 = 0x138;
  memcpy(&this->mt_,local_1d60,0x9c8);
  *(undefined4 *)&(this->dist_)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->dist_)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->dist_)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->dist_)._M_param._M_b + 4) = 0x3ff00000;
  std::random_device::_M_fini();
  return;
}

Assistant:

void _setup_random_number_generator() {
        // set up random number generator
        // ref: https://stackoverflow.com/a/19666713/11199009
        std::random_device rd;
        // ref: https://www.cplusplus.com/reference/random/mt19937_64/
        std::mt19937_64 mt(rd());
        // usage of this is: dist(mt)
        std::uniform_real_distribution<double> dist(0.0, 1.0);

        this->mt_ = mt;
        this->dist_ = dist;
    }